

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QList<QTzTransition> * parseTzTransitions(QDataStream *ds,int tzh_timecnt,bool longTran)

{
  long lVar1;
  Status SVar2;
  reference pQVar3;
  byte in_CL;
  int in_EDX;
  QDataStream *in_RSI;
  QList<QTzTransition> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  int i_2;
  int i_1;
  int i;
  QList<QTzTransition> *transitions;
  quint8 typeind;
  qint32 val;
  quint8 *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  quint8 in_stack_ffffffffffffff57;
  QDataStream *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_44;
  int local_40;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTzTransition>::QList
            ((QList<QTzTransition> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (qsizetype)in_stack_ffffffffffffff58);
  if ((in_CL & 1) == 0) {
    local_40 = 0;
    while( true ) {
      bVar4 = false;
      if (local_40 < in_EDX) {
        SVar2 = QDataStream::status(in_RSI);
        bVar4 = SVar2 == Ok;
      }
      if (!bVar4) break;
      QDataStream::operator>>
                (in_stack_ffffffffffffff58,
                 (qint32 *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      pQVar3 = QList<QTzTransition>::operator[]
                         ((QList<QTzTransition> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (qsizetype)in_stack_ffffffffffffff48);
      pQVar3->tz_time = -0x55555556;
      SVar2 = QDataStream::status(in_RSI);
      if (SVar2 != Ok) {
        QList<QTzTransition>::resize
                  ((QList<QTzTransition> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (qsizetype)in_stack_ffffffffffffff58);
      }
      local_40 = local_40 + 1;
    }
  }
  else {
    local_2c = 0;
    while( true ) {
      bVar4 = false;
      if (local_2c < in_EDX) {
        SVar2 = QDataStream::status(in_RSI);
        bVar4 = SVar2 == Ok;
      }
      if (!bVar4) break;
      QList<QTzTransition>::operator[]
                ((QList<QTzTransition> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 (qsizetype)in_stack_ffffffffffffff48);
      QDataStream::operator>>
                (in_stack_ffffffffffffff58,
                 (qint64 *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      SVar2 = QDataStream::status(in_RSI);
      if (SVar2 != Ok) {
        QList<QTzTransition>::resize
                  ((QList<QTzTransition> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (qsizetype)in_stack_ffffffffffffff58);
      }
      local_2c = local_2c + 1;
    }
  }
  local_44 = 0;
  while( true ) {
    bVar4 = false;
    if (local_44 < in_EDX) {
      SVar2 = QDataStream::status(in_RSI);
      bVar4 = SVar2 == Ok;
    }
    if (!bVar4) break;
    QDataStream::operator>>
              ((QDataStream *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    SVar2 = QDataStream::status(in_RSI);
    if (SVar2 == Ok) {
      in_stack_ffffffffffffff57 = 0xaa;
      pQVar3 = QList<QTzTransition>::operator[]
                         ((QList<QTzTransition> *)CONCAT17(0xaa,in_stack_ffffffffffffff50),
                          (qsizetype)in_stack_ffffffffffffff48);
      pQVar3->tz_typeind = in_stack_ffffffffffffff57;
    }
    local_44 = local_44 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QTzTransition> parseTzTransitions(QDataStream &ds, int tzh_timecnt, bool longTran)
{
    QList<QTzTransition> transitions(tzh_timecnt);

    if (longTran) {
        // Parse tzh_timecnt x 8-byte transition times
        for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
            ds >> transitions[i].tz_time;
            if (ds.status() != QDataStream::Ok)
                transitions.resize(i);
        }
    } else {
        // Parse tzh_timecnt x 4-byte transition times
        qint32 val;
        for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
            ds >> val;
            transitions[i].tz_time = val;
            if (ds.status() != QDataStream::Ok)
                transitions.resize(i);
        }
    }

    // Parse tzh_timecnt x 1-byte transition type index
    for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
        quint8 typeind;
        ds >> typeind;
        if (ds.status() == QDataStream::Ok)
            transitions[i].tz_typeind = typeind;
    }

    return transitions;
}